

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O3

int __thiscall
TPZCheckMesh::VerifyCompatibilityBetweenNShapesAndBlockSize(TPZCheckMesh *this,int connect)

{
  uint uVar1;
  TPZConnect *pTVar2;
  
  pTVar2 = TPZChunkVector<TPZConnect,_10>::operator[]
                     (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,(long)connect
                     );
  uVar1 = 1;
  if ((((pTVar2->fDependList == (TPZDepend *)0x0) &&
       ((pTVar2->field_2).fCompose.fIsCondensed == false)) && (pTVar2->fNElConnected != 0)) &&
     (pTVar2->fSequenceNumber != -1)) {
    uVar1 = (uint)((this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                   [(int)pTVar2->fSequenceNumber].dim ==
                  (uint)(pTVar2->field_2).fCompose.fNState * pTVar2->fNShape);
  }
  return uVar1;
}

Assistant:

int TPZCheckMesh::VerifyCompatibilityBetweenNShapesAndBlockSize(int connect) {
	int check = 1;
	TPZConnect &df = fMesh->ConnectVec()[connect];
	if(df.HasDependency() || df.IsCondensed() || !df.NElConnected() || df.SequenceNumber() == -1) return check;
	int dofsize = df.NShape()*df.NState();
	// check the consistency between the block size and the data structure of the connect
	{
		int seqnum = df.SequenceNumber();
		int blsize = fMesh->Block().Size(seqnum);
		if (blsize != dofsize) {
			check = 0;
		}
	}
	return check;
}